

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcAbc.c
# Opt level: O0

Abc_Ntk_t * Wlc_NtkGetInv(Wlc_Ntk_t *pNtk,Vec_Int_t *vInv,Vec_Str_t *vSop,int fVerbose)

{
  Mem_Flex_t *pMan;
  int iVar1;
  int iVar2;
  Abc_Ntk_t *pNtk_00;
  char *pcVar3;
  Wlc_Obj_t *p;
  Abc_Obj_t *pAVar4;
  char local_13e8 [8];
  char Buffer [5000];
  Abc_Obj_t *pMainTemp;
  Abc_Obj_t *pMainObj;
  Abc_Ntk_t *pMainNtk;
  int nBits;
  int nRange;
  int nNum;
  int k;
  int i;
  Wlc_Obj_t *pObj;
  int fVerbose_local;
  Vec_Str_t *vSop_local;
  Vec_Int_t *vInv_local;
  Wlc_Ntk_t *pNtk_local;
  
  pMainNtk._4_4_ = 0;
  pNtk_00 = Abc_NtkAlloc(ABC_NTK_LOGIC,ABC_FUNC_SOP,1);
  pcVar3 = Extra_UtilStrsav(pNtk->pName);
  pNtk_00->pName = pcVar3;
  for (nNum = 0; iVar1 = Wlc_NtkCiNum(pNtk), nNum < iVar1; nNum = nNum + 1) {
    p = Wlc_NtkCi(pNtk,nNum);
    if ((undefined1  [24])((undefined1  [24])*p & (undefined1  [24])0x3f) == (undefined1  [24])0x3)
    {
      iVar1 = Wlc_ObjRange(p);
      nRange = 0;
      while ((nRange < iVar1 && (iVar2 = Vec_IntEntry(vInv,pMainNtk._4_4_ + nRange), iVar2 == 0))) {
        nRange = nRange + 1;
      }
      if (nRange == iVar1) {
        pMainNtk._4_4_ = iVar1 + pMainNtk._4_4_;
      }
      else {
        for (nRange = 0; nRange < iVar1; nRange = nRange + 1) {
          iVar2 = Vec_IntEntry(vInv,pMainNtk._4_4_ + nRange);
          if (iVar2 != 0) {
            pAVar4 = Abc_NtkCreatePi(pNtk_00);
            iVar2 = Wlc_ObjId(pNtk,p);
            pcVar3 = Wlc_ObjName(pNtk,iVar2);
            sprintf(local_13e8,"%s[%d]",pcVar3,(ulong)(uint)nRange);
            Abc_ObjAssignName(pAVar4,local_13e8,(char *)0x0);
          }
        }
        pMainNtk._4_4_ = iVar1 + pMainNtk._4_4_;
      }
    }
  }
  iVar1 = Vec_IntSize(vInv);
  if (iVar1 == pMainNtk._4_4_) {
    pAVar4 = Abc_NtkCreateNode(pNtk_00);
    for (nNum = 0; iVar1 = Abc_NtkPiNum(pNtk_00), nNum < iVar1; nNum = nNum + 1) {
      Buffer._4992_8_ = Abc_NtkPi(pNtk_00,nNum);
      Abc_ObjAddFanin(pAVar4,(Abc_Obj_t *)Buffer._4992_8_);
    }
    pMan = (Mem_Flex_t *)pNtk_00->pManFunc;
    pcVar3 = Vec_StrArray(vSop);
    pcVar3 = Abc_SopRegister(pMan,pcVar3);
    (pAVar4->field_5).pData = pcVar3;
    Buffer._4992_8_ = Abc_NtkCreatePo(pNtk_00);
    Abc_ObjAddFanin((Abc_Obj_t *)Buffer._4992_8_,pAVar4);
    Abc_ObjAssignName((Abc_Obj_t *)Buffer._4992_8_,"inv",(char *)0x0);
    return pNtk_00;
  }
  __assert_fail("Vec_IntSize(vInv) == nBits",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/wlc/wlcAbc.c"
                ,0x87,"Abc_Ntk_t *Wlc_NtkGetInv(Wlc_Ntk_t *, Vec_Int_t *, Vec_Str_t *, int)");
}

Assistant:

Abc_Ntk_t * Wlc_NtkGetInv( Wlc_Ntk_t * pNtk, Vec_Int_t * vInv, Vec_Str_t * vSop, int fVerbose )
{
    Wlc_Obj_t * pObj;
    int i, k, nNum, nRange, nBits = 0;
    Abc_Ntk_t * pMainNtk = NULL;
    Abc_Obj_t * pMainObj, * pMainTemp;
    char Buffer[5000];
    // start the network
    pMainNtk = Abc_NtkAlloc( ABC_NTK_LOGIC, ABC_FUNC_SOP, 1 );
    // duplicate the name and the spec
    pMainNtk->pName = Extra_UtilStrsav(pNtk->pName);
    // create primary inputs
    Wlc_NtkForEachCi( pNtk, pObj, i )
    {
        if ( pObj->Type != WLC_OBJ_FO )
            continue;
        nRange = Wlc_ObjRange(pObj);
        for ( k = 0; k < nRange; k++ )
        {
            nNum = Vec_IntEntry(vInv, nBits + k);
            if ( nNum )
                break;
        }
        if ( k == nRange )
        {
            nBits += nRange;
            continue;
        }
        //printf( "%s[%d:%d] : ", Wlc_ObjName(pNtk, Wlc_ObjId(pNtk, pObj)), pObj->End, pObj->Beg );
        for ( k = 0; k < nRange; k++ )
        {
            nNum = Vec_IntEntry( vInv, nBits + k );
            if ( nNum == 0 )
                continue;
            //printf( "  [%d] -> %d", k, nNum );
            pMainObj = Abc_NtkCreatePi( pMainNtk );
            sprintf( Buffer, "%s[%d]", Wlc_ObjName(pNtk, Wlc_ObjId(pNtk, pObj)), k );
            Abc_ObjAssignName( pMainObj, Buffer, NULL );

        }
        //printf( "\n");
        nBits += nRange;
    }
    //printf( "%d %d\n", Vec_IntSize(vInv), nBits );
    assert( Vec_IntSize(vInv) == nBits );
    // create node
    pMainObj = Abc_NtkCreateNode( pMainNtk );
    Abc_NtkForEachPi( pMainNtk, pMainTemp, i )
        Abc_ObjAddFanin( pMainObj, pMainTemp );
    pMainObj->pData = Abc_SopRegister( (Mem_Flex_t *)pMainNtk->pManFunc, Vec_StrArray(vSop) );
    // create PO
    pMainTemp = Abc_NtkCreatePo( pMainNtk );
    Abc_ObjAddFanin( pMainTemp, pMainObj );
    Abc_ObjAssignName( pMainTemp, "inv", NULL );
    return pMainNtk;
}